

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
cs::translator_type::match_grammar
          (translator_type *this,context_t *context,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw)

{
  ulong uVar1;
  bool bVar2;
  action_types aVar3;
  int iVar4;
  action_types aVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  reference pptVar8;
  size_type sVar9;
  reference pptVar10;
  var_id *pvVar11;
  action_types *paVar12;
  var_id *id_3;
  var_id *id_2;
  token_base **it_1;
  iterator __end3_1;
  iterator __begin3_1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range3_1;
  size_t i_1;
  bool skip_useless_1;
  var_id *id_1;
  var_id *id;
  token_base **it;
  iterator __end3;
  iterator __begin3;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range3;
  size_t i;
  bool skip_useless;
  bool failed;
  bool matched;
  shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>
  *dat;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  *__range1;
  _Self *in_stack_fffffffffffffe88;
  _Self *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_e0;
  element_type *local_c0;
  ulong local_b8;
  byte local_a9;
  var_id *local_a8;
  var_id *local_a0;
  reference local_98;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_70;
  element_type *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  byte local_3b;
  byte local_3a;
  byte local_39;
  reference local_38;
  _Self local_30;
  _Self local_28 [5];
  
  local_28[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
       ::begin((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                *)in_stack_fffffffffffffe88);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
       ::end((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
              *)in_stack_fffffffffffffe88);
  do {
    bVar2 = std::operator!=(local_28,&local_30);
    if (!bVar2) {
      return;
    }
    local_38 = std::
               _List_iterator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>
               ::operator*((_List_iterator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>
                            *)in_stack_fffffffffffffe90);
    local_39 = 0;
    local_3a = 0;
    local_3b = 0;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_50 = std::
               __shared_ptr_access<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x58529d);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
               in_stack_fffffffffffffe88);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
               in_stack_fffffffffffffe88);
    while (bVar2 = std::operator!=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88), bVar2) {
      local_98 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                 operator*(&local_70);
      in_stack_fffffffffffffee4 = (*(*local_98)->_vptr_token_base[2])();
      if (in_stack_fffffffffffffee4 == 2) {
        if ((local_3b & 1) != 0) {
          while (in_stack_fffffffffffffed8 = local_48,
                pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                                   ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                    0x585361), in_stack_fffffffffffffed8 < pbVar6) {
            pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                                 ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                  in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
            iVar4 = (*(*pptVar10)->_vptr_token_base[2])();
            if (iVar4 == 4) {
              pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                                   ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                    in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
              local_a0 = token_id::get_id((token_id *)*pptVar10);
              std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x5853cb);
              std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x5853d3);
              var_id::operator_cast_to_string_(local_a0);
              bVar2 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                      ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                               *)in_stack_fffffffffffffe90,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe88);
              if (bVar2) {
                std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x585402);
                std::
                __shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x58540a);
                var_id::operator_cast_to_string_(local_a0);
                paVar12 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                          ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                   *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  in_stack_fffffffffffffed8);
                aVar3 = *paVar12;
                aVar5 = token_action::get_action((token_action *)*local_98);
                if (aVar3 == aVar5) break;
              }
            }
            else {
              pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                                   ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                    in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
              iVar4 = (*(*pptVar10)->_vptr_token_base[2])();
              if (iVar4 == 2) break;
            }
            local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_48->field_0x1;
          }
        }
        pbVar6 = local_48;
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                           ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5854a8);
        if (pbVar6 < pbVar7) {
          pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                               ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          iVar4 = (*(*pptVar10)->_vptr_token_base[2])();
          if (iVar4 == 4) {
            pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                                 ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                  in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
            local_a8 = token_id::get_id((token_id *)*pptVar10);
            std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x58551b);
            std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x585523);
            var_id::operator_cast_to_string_(local_a8);
            bVar2 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                    ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                             *)in_stack_fffffffffffffe90,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe88);
            if (bVar2) {
              std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x585552);
              std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x58555a);
              var_id::operator_cast_to_string_(local_a8);
              paVar12 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                        ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                in_stack_fffffffffffffed8);
              aVar3 = *paVar12;
              aVar5 = token_action::get_action((token_action *)*local_98);
              if (aVar3 == aVar5) {
                local_39 = 1;
                goto LAB_00585626;
              }
            }
            local_39 = 0;
            local_3a = 1;
          }
          else {
            pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                                 ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                  in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
            iVar4 = (*(*pptVar10)->_vptr_token_base[2])();
            if (iVar4 == 2) {
              pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                                   ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                    in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
              aVar3 = token_action::get_action((token_action *)*pptVar10);
              aVar5 = token_action::get_action((token_action *)*local_98);
              local_3a = aVar3 != aVar5;
            }
            else {
              local_3a = 1;
            }
          }
LAB_00585626:
          local_3b = 0;
          local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_48->field_0x1;
        }
        else {
          local_3a = 1;
        }
      }
      else if (in_stack_fffffffffffffee4 == 0xc) {
        local_3b = 1;
      }
      if ((local_3a & 1) != 0) break;
      std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
                (in_stack_fffffffffffffe90);
    }
    pbVar6 = local_48;
    if ((((local_3b & 1) != 0) &&
        (pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x585690)
        , pbVar6 == pbVar7)) ||
       ((pbVar6 = local_48, (local_3b & 1) == 0 &&
        (pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5856c1)
        , pbVar6 < pbVar7)))) {
      local_39 = 0;
    }
    if ((local_39 & 1) != 0) {
      local_a9 = 0;
      local_b8 = 0;
      local_c0 = std::
                 __shared_ptr_access<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x585705);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffe88);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffe88);
      while (bVar2 = std::operator!=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88), bVar2) {
        pptVar8 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                  operator*(&local_e0);
        iVar4 = (*(*pptVar8)->_vptr_token_base[2])();
        if (iVar4 == 2) {
          if ((local_a9 & 1) != 0) {
            for (; uVar1 = local_b8,
                sVar9 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                   0x5857bd), uVar1 < sVar9; local_b8 = local_b8 + 1) {
              pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                                   ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                    in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
              iVar4 = (*(*pptVar10)->_vptr_token_base[2])();
              if (iVar4 == 4) {
                pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::
                           operator[]((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                      in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88
                                     );
                pvVar11 = token_id::get_id((token_id *)*pptVar10);
                std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x585824);
                std::
                __shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x58582c);
                var_id::operator_cast_to_string_(pvVar11);
                bVar2 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                        ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                 *)in_stack_fffffffffffffe90,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe88);
                if (bVar2) {
                  std::
                  __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x585858);
                  std::
                  __shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x585860);
                  var_id::operator_cast_to_string_(pvVar11);
                  paVar12 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                            ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                     *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                                    ,in_stack_fffffffffffffed8);
                  aVar3 = *paVar12;
                  aVar5 = token_action::get_action((token_action *)*pptVar8);
                  if (aVar3 == aVar5) break;
                }
              }
              else {
                pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::
                           operator[]((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                      in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88
                                     );
                iVar4 = (*(*pptVar10)->_vptr_token_base[2])();
                if (iVar4 == 2) break;
              }
            }
          }
          pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                               ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
          iVar4 = (*(*pptVar10)->_vptr_token_base[2])();
          if (iVar4 == 4) {
            pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::operator[]
                                 ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                  in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
            pvVar11 = token_id::get_id((token_id *)*pptVar10);
            std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x585934);
            std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x58593c);
            var_id::operator_cast_to_string_(pvVar11);
            bVar2 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                    ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                             *)in_stack_fffffffffffffe90,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe88);
            if (bVar2) {
              std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x585968);
              std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x585970);
              var_id::operator_cast_to_string_(pvVar11);
              paVar12 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                        ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                in_stack_fffffffffffffed8);
              aVar3 = *paVar12;
              aVar5 = token_action::get_action((token_action *)*pptVar8);
              if (aVar3 == aVar5) {
                in_stack_fffffffffffffe90 = (_Self *)*pptVar8;
                pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::
                           operator[]((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                      in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88
                                     );
                *pptVar10 = (value_type)in_stack_fffffffffffffe90;
              }
            }
          }
          local_a9 = 0;
          local_b8 = local_b8 + 1;
        }
        else if (iVar4 == 0xc) {
          local_a9 = 1;
        }
        std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
                  (in_stack_fffffffffffffe90);
      }
    }
    std::
    _List_iterator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>
    ::operator++(local_28);
  } while( true );
}

Assistant:

void translator_type::match_grammar(const context_t &context, std::deque<token_base *> &raw)
	{
		for (auto &dat: m_data) {
			bool matched = false;
			{
				bool failed = false, skip_useless = false;
				std::size_t i = 0;
				for (auto &it: dat->first) {
					switch (it->get_type()) {
					default:
						break;
					case token_types::action: {
						if (skip_useless) {
							// Keep looking for id token or action token that have been replaced.
							for (; i < raw.size(); ++i) {
								if (raw[i]->get_type() == token_types::id) {
									auto &id = static_cast<token_id *>(raw[i])->get_id();
									if (context->compiler->action_map.exist(id) &&
									        context->compiler->action_map.match(id) ==
									        static_cast<token_action *>(it)->get_action())
										break;
								}
								else if (raw[i]->get_type() == token_types::action)
									break;
							}
						}
						if (i >= raw.size()) {
							failed = true;
							break;
						}
						// The "matched" condition is satisfied only if the target token is an id and it can match the grammar rule.
						if (raw[i]->get_type() == token_types::id) {
							auto &id = static_cast<token_id *>(raw[i])->get_id();
							if (!context->compiler->action_map.exist(id) ||
							        context->compiler->action_map.match(id) !=
							        static_cast<token_action *>(it)->get_action()) {
								matched = false;
								failed = true;
							}
							else
								matched = true;
						}
						else if (raw[i]->get_type() == token_types::action)
							failed = static_cast<token_action *>(raw[i])->get_action() !=
							         static_cast<token_action *>(it)->get_action();
						else
							failed = true;
						skip_useless = false;
						++i;
						break;
					}
					case token_types::expr:
						skip_useless = true;
						break;
					}
					if (failed)
						break;
				}
				if ((skip_useless && i == raw.size()) || (!skip_useless && i < raw.size()))
					matched = false;
			}
			if (matched) {
				// If matched, find and replace all id token with correspondent action token.
				bool skip_useless = false;
				std::size_t i = 0;
				for (auto &it: dat->first) {
					switch (it->get_type()) {
					default:
						break;
					case token_types::action: {
						if (skip_useless) {
							// Keep looking for id token or action token that have been replaced.
							for (; i < raw.size(); ++i) {
								if (raw[i]->get_type() == token_types::id) {
									auto &id = static_cast<token_id *>(raw[i])->get_id();
									if (context->compiler->action_map.exist(id) &&
									        context->compiler->action_map.match(id) ==
									        static_cast<token_action *>(it)->get_action())
										break;
								}
								else if (raw[i]->get_type() == token_types::action)
									break;
							}
						}
						if (raw[i]->get_type() == token_types::id) {
							auto &id = static_cast<token_id *>(raw[i])->get_id();
							if (context->compiler->action_map.exist(id) &&
							        context->compiler->action_map.match(id) ==
							        static_cast<token_action *>(it)->get_action())
								raw[i] = it;
						}
						skip_useless = false;
						++i;
						break;
					}
					case token_types::expr:
						skip_useless = true;
						break;
					}
				}
			}
		}
	}